

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_slab.c
# Opt level: O2

void ngx_slab_init(ngx_slab_pool_t *pool)

{
  ngx_slab_pool_t *pnVar1;
  ngx_slab_page_t *pnVar2;
  ngx_uint_t nVar3;
  ulong uVar4;
  ulong uVar5;
  ngx_slab_pool_t *pnVar6;
  long lVar7;
  u_char *puVar8;
  long lVar9;
  ngx_slab_stat_t *pnVar10;
  bool bVar11;
  
  if (ngx_slab_max_size == 0) {
    ngx_slab_max_size = ngx_pagesize >> 1;
    ngx_slab_exact_size = ngx_pagesize >> 6;
    for (uVar4 = ngx_slab_exact_size; 1 < uVar4; uVar4 = uVar4 >> 1) {
      ngx_slab_exact_shift = ngx_slab_exact_shift + 1;
    }
  }
  puVar8 = pool->end;
  pool->min_size = 1L << ((byte)pool->min_shift & 0x3f);
  pnVar1 = pool + 1;
  lVar9 = ngx_pagesize_shift - pool->min_shift;
  pnVar6 = pnVar1;
  lVar7 = lVar9;
  while (bVar11 = lVar7 != 0, lVar7 = lVar7 + -1, bVar11) {
    (pnVar6->lock).lock = 0;
    pnVar6->min_size = (size_t)pnVar6;
    pnVar6->min_shift = 0;
    pnVar6 = (ngx_slab_pool_t *)&pnVar6->pages;
  }
  pnVar10 = (ngx_slab_stat_t *)(lVar9 * 0x18 + (long)pnVar1);
  pool->stats = pnVar10;
  memset(pnVar10,0,lVar9 * 0x20);
  pnVar10 = pnVar10 + lVar9;
  uVar4 = (ulong)(puVar8 + (lVar9 * -0x38 - (long)pnVar1)) / (ngx_pagesize + 0x18);
  pool->pages = (ngx_slab_page_t *)pnVar10;
  memset(pnVar10,0,uVar4 * 0x18);
  pnVar2 = pool->pages;
  (pool->free).slab = 0;
  (pool->free).next = pnVar2;
  (pool->free).prev = 0;
  pnVar2->slab = uVar4;
  pnVar2->next = &pool->free;
  pnVar2->prev = (uintptr_t)&pool->free;
  nVar3 = ngx_pagesize;
  puVar8 = (u_char *)(-ngx_pagesize & (long)pnVar10 + ngx_pagesize + uVar4 * 0x18 + -1);
  pool->start = puVar8;
  uVar5 = (ulong)((long)pool->end - (long)puVar8) / nVar3;
  if (uVar4 != uVar5 && -1 < (long)(uVar4 - uVar5)) {
    pnVar2->slab = uVar5;
    uVar4 = uVar5;
  }
  pool->last = pnVar2 + uVar4;
  pool->pfree = uVar4;
  pool->field_0x79 = pool->field_0x79 | 1;
  pool->log_ctx = &pool->zero;
  pool->zero = '\0';
  return;
}

Assistant:

void
ngx_slab_init(ngx_slab_pool_t *pool)
{
    u_char           *p;
    size_t            size;
    ngx_int_t         m;
    ngx_uint_t        i, n, pages;
    ngx_slab_page_t  *slots, *page;

    /* STUB */
    if (ngx_slab_max_size == 0) {
        ngx_slab_max_size = ngx_pagesize / 2;
        ngx_slab_exact_size = ngx_pagesize / (8 * sizeof(uintptr_t));
        for (n = ngx_slab_exact_size; n >>= 1; ngx_slab_exact_shift++) {
            /* void */
        }
    }
    /**/

    pool->min_size = (size_t) 1 << pool->min_shift;

    slots = ngx_slab_slots(pool);

    p = (u_char *) slots;
    size = pool->end - p;

    ngx_slab_junk(p, size);

    n = ngx_pagesize_shift - pool->min_shift;

    for (i = 0; i < n; i++) {
        /* only "next" is used in list head */
        slots[i].slab = 0;
        slots[i].next = &slots[i];
        slots[i].prev = 0;
    }

    p += n * sizeof(ngx_slab_page_t);

    pool->stats = (ngx_slab_stat_t *) p;
    ngx_memzero(pool->stats, n * sizeof(ngx_slab_stat_t));

    p += n * sizeof(ngx_slab_stat_t);

    size -= n * (sizeof(ngx_slab_page_t) + sizeof(ngx_slab_stat_t));

    pages = (ngx_uint_t) (size / (ngx_pagesize + sizeof(ngx_slab_page_t)));

    pool->pages = (ngx_slab_page_t *) p;
    ngx_memzero(pool->pages, pages * sizeof(ngx_slab_page_t));

    page = pool->pages;

    /* only "next" is used in list head */
    pool->free.slab = 0;
    pool->free.next = page;
    pool->free.prev = 0;

    page->slab = pages;
    page->next = &pool->free;
    page->prev = (uintptr_t) &pool->free;

    pool->start = ngx_align_ptr(p + pages * sizeof(ngx_slab_page_t),
                                ngx_pagesize);

    m = pages - (pool->end - pool->start) / ngx_pagesize;
    if (m > 0) {
        pages -= m;
        page->slab = pages;
    }

    pool->last = pool->pages + pages;
    pool->pfree = pages;

    pool->log_nomem = 1;
    pool->log_ctx = &pool->zero;
    pool->zero = '\0';
}